

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

void __thiscall QAbstractSpinBoxPrivate::updateEdit(QAbstractSpinBoxPrivate *this)

{
  QVariant *pQVar1;
  undefined2 uVar2;
  QWidget *this_00;
  QLineEdit *pQVar3;
  long lVar4;
  long lVar5;
  int length;
  char cVar6;
  int iVar7;
  P _a;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QStringView QVar10;
  QStringView QVar11;
  QString local_b0;
  QArrayData *local_98;
  char16_t *pcStack_90;
  qsizetype local_88;
  QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&> local_80;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->type != UnknownType) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    pQVar1 = &this->value;
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    cVar6 = ::QVariant::equals(pQVar1);
    if (cVar6 == '\0') {
      bVar9 = false;
    }
    else {
      bVar9 = (this->specialValueText).d.size != 0;
    }
    if (bVar9) {
      local_58.d.d = (this->specialValueText).d.d;
      local_58.d.ptr = (this->specialValueText).d.ptr;
      local_58.d.size = (this->specialValueText).d.size;
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      (**(code **)(*(long *)&this->super_QWidgetPrivate + 0xd8))(&local_98,this,pQVar1);
      local_80.a.b.d.size = local_88;
      local_80.a.b.d.ptr = pcStack_90;
      local_80.a.b.d.d = (Data *)local_98;
      local_88 = 0;
      local_80.b = &this->suffix;
      local_98 = (QArrayData *)0x0;
      pcStack_90 = (char16_t *)0x0;
      local_80.a.a = &this->prefix;
      QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&>::convertTo<QString>
                (&local_58,&local_80);
    }
    if (!bVar9) {
      if (&(local_80.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_80.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_80.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_80.a.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98,2,0x10);
        }
      }
    }
    QLineEdit::displayText(&local_b0,this->edit);
    if (((undefined1 *)local_58.d.size ==
         (undefined1 *)CONCAT44(local_b0.d.size._4_4_,(int)local_b0.d.size)) &&
       (QVar10.m_data = local_58.d.ptr, QVar10.m_size = local_58.d.size,
       QVar11.m_data = local_b0.d.ptr,
       QVar11.m_size = (qsizetype)CONCAT44(local_b0.d.size._4_4_,(int)local_b0.d.size),
       cVar6 = QtPrivate::equalStrings(QVar10,QVar11), cVar6 != '\0')) {
      if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      uVar2 = *(undefined2 *)&this->field_0x3d0;
      if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (-1 < (char)uVar2) {
        QLineEdit::text(&local_b0,this->edit);
        lVar5 = CONCAT44(local_b0.d.size._4_4_,(int)local_b0.d.size);
        if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
          }
        }
        iVar7 = QLineEdit::cursorPosition(this->edit);
        QLineEdit::selectedText(&local_b0,this->edit);
        length = (int)local_b0.d.size;
        if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar3 = this->edit;
        if (pQVar3 != (QLineEdit *)0x0) {
          QObject::blockSignals(SUB81(pQVar3,0));
        }
        QLineEdit::setText(this->edit,&local_58);
        cVar6 = ::QVariant::equals(pQVar1);
        if ((cVar6 == '\0') || ((this->specialValueText).d.size == 0)) {
          lVar4 = (this->prefix).d.size;
          QLineEdit::displayText(&local_b0,this->edit);
          lVar8 = CONCAT44(local_b0.d.size._4_4_,(int)local_b0.d.size) - (this->suffix).d.size;
          if (iVar7 <= lVar8) {
            lVar8 = (long)iVar7;
          }
          if (lVar8 < lVar4) {
            lVar8 = lVar4;
          }
          iVar7 = (int)lVar8;
          if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (length < 1) {
            if (lVar5 == 0) {
              iVar7 = (int)(this->prefix).d.size;
            }
            QLineEdit::setCursorPosition(this->edit,iVar7);
          }
          else {
            QLineEdit::setSelection(this->edit,iVar7,length);
          }
        }
        QWidget::update(this_00);
        if (pQVar3 != (QLineEdit *)0x0) {
          QObject::blockSignals(SUB81(pQVar3,0));
        }
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBoxPrivate::updateEdit()
{
    Q_Q(QAbstractSpinBox);
    if (type == QMetaType::UnknownType)
        return;
    const QString newText = specialValue() ? specialValueText : prefix + textFromValue(value) + suffix;
    if (newText == edit->displayText() || cleared)
        return;

    const bool empty = edit->text().isEmpty();
    int cursor = edit->cursorPosition();
    int selsize = edit->selectedText().size();
    const QSignalBlocker blocker(edit);
    edit->setText(newText);

    if (!specialValue()) {
        cursor = qBound(prefix.size(), cursor, edit->displayText().size() - suffix.size());

        if (selsize > 0) {
            edit->setSelection(cursor, selsize);
        } else {
            edit->setCursorPosition(empty ? prefix.size() : cursor);
        }
    }
    q->update();
}